

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

pair<double_*,_bool> __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<4>::insert_entry
          (InnerLeaf<4> *this,uint64_t fullHash,int hashPos,Entry *entry)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  int iVar7;
  ulong uVar8;
  unsigned_long *puVar9;
  undefined8 uVar10;
  int in_R8D;
  ulong uVar11;
  int iVar13;
  undefined1 auVar12 [16];
  pair<double_*,_bool> pVar14;
  int local_1c;
  
  uVar11 = fullHash >> ((char)hashPos * -6 + 0x30U & 0x3f);
  bVar1 = (byte)(uVar11 >> 10);
  uVar8 = (this->occupation).occupation;
  lVar4 = POPCOUNT(uVar8 >> (bVar1 & 0x3f));
  local_1c = (int)lVar4;
  if ((uVar8 >> (uVar11 >> 10 & 0x3f) & 1) == 0) {
    (this->occupation).occupation = uVar8 | 1L << (bVar1 & 0x3f);
    if (local_1c < this->size) {
      iVar7 = local_1c + -1;
      puVar9 = (this->hashes)._M_elems + local_1c;
      do {
        iVar7 = iVar7 + 1;
        uVar8 = *puVar9;
        puVar9 = puVar9 + 1;
        local_1c = iVar7;
      } while ((uVar11 & 0xffff) < uVar8);
    }
  }
  else {
    uVar8 = (ulong)(uint)(local_1c * 8);
    lVar4 = lVar4 + -2;
    do {
      uVar8 = uVar8 + 8;
      lVar5 = lVar4 + 1;
      lVar2 = lVar4 + 1;
      lVar4 = lVar5;
    } while ((uVar11 & 0xffff) < (this->hashes)._M_elems[lVar2]);
    iVar3 = (int)lVar5;
    iVar7 = this->size;
    local_1c = iVar3;
    if (iVar7 != iVar3) {
      do {
        local_1c = iVar3;
        if (*(ulong *)((long)(this->hashes)._M_elems + (uVar8 - 0x10)) != (uVar11 & 0xffff)) break;
        uVar10 = *(undefined8 *)((long)((this->entries)._M_elems + -2) + uVar8 * 2);
        auVar12._0_4_ = -(uint)((int)uVar10 == (entry->key_).first);
        iVar13 = -(uint)((int)((ulong)uVar10 >> 0x20) == (entry->key_).second);
        auVar12._4_4_ = auVar12._0_4_;
        auVar12._8_4_ = iVar13;
        auVar12._12_4_ = iVar13;
        in_R8D = movmskpd(in_R8D,auVar12);
        if (in_R8D == 3) {
          pdVar6 = &(this->entries)._M_elems[iVar3].value_;
          uVar10 = 0;
          goto LAB_0032e225;
        }
        lVar5 = lVar5 + 1;
        uVar8 = uVar8 + 8;
        iVar3 = (int)lVar5;
        local_1c = iVar7;
      } while (iVar7 != iVar3);
    }
  }
  if (local_1c < this->size) {
    move_backward(this,&local_1c,&this->size);
  }
  lVar4 = (long)local_1c;
  pdVar6 = &(this->entries)._M_elems[lVar4].value_;
  (this->entries)._M_elems[lVar4].key_.first = (entry->key_).first;
  (this->entries)._M_elems[lVar4].key_.second = (entry->key_).second;
  *pdVar6 = entry->value_;
  (this->hashes)._M_elems[lVar4] = uVar11 & 0xffff;
  iVar7 = this->size;
  lVar4 = (long)iVar7 + 1;
  this->size = (int)lVar4;
  (this->hashes)._M_elems[(long)iVar7 + 1] = 0;
  uVar10 = CONCAT71((int7)((ulong)lVar4 >> 8),1);
LAB_0032e225:
  pVar14._8_8_ = uVar10;
  pVar14.first = pdVar6;
  return pVar14;
}

Assistant:

std::pair<ValueType*, bool> insert_entry(uint64_t fullHash, int hashPos,
                                             Entry& entry) {
      assert(size < capacity());
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);

      int pos = occupation.num_set_until(hashChunk);

      if (occupation.test(hashChunk)) {
        // since the occupation flag is set we need to start searching from
        // pos-1 and can rely on a hash chunk with the same value existing for
        // the scan
        --pos;
        while (hashes[pos] > hash) ++pos;

        if (find_key(entry.key(), hash, pos))
          return std::make_pair(&entries[pos].value(), false);

      } else {
        occupation.set(hashChunk);

        if (pos < size)
          while (hashes[pos] > hash) ++pos;
      }

      if (pos < size) move_backward(pos, size);
      entries[pos] = std::move(entry);
      hashes[pos] = hash;
      ++size;
      hashes[size] = 0;

      return std::make_pair(&entries[pos].value(), true);
    }